

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<de::Semaphore>::SharedPtr(SharedPtr<de::Semaphore> *this,Semaphore *ptr)

{
  Semaphore *pSVar1;
  SharedPtrState<de::Semaphore,_de::DefaultDeleter<de::Semaphore>_> *pSVar2;
  DefaultDeleter<de::Semaphore> local_25 [13];
  Semaphore *local_18;
  Semaphore *ptr_local;
  SharedPtr<de::Semaphore> *this_local;
  
  this->m_ptr = (Semaphore *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Semaphore *)this;
  pSVar2 = (SharedPtrState<de::Semaphore,_de::DefaultDeleter<de::Semaphore>_> *)operator_new(0x20);
  pSVar1 = local_18;
  DefaultDeleter<de::Semaphore>::DefaultDeleter(local_25);
  SharedPtrState<de::Semaphore,_de::DefaultDeleter<de::Semaphore>_>::SharedPtrState(pSVar2,pSVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}